

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsContInt
          (ChElementBeamANCF_3333 *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_> *pPVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  undefined8 *puVar18;
  uint uVar19;
  undefined1 *puVar20;
  long lVar21;
  undefined1 *puVar22;
  uint uVar23;
  double *pdVar24;
  long lVar25;
  ulong uVar26;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong uVar27;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ChMatrix33<double> J_0xi;
  type tmp;
  MatrixNx3c Sxi_D;
  assign_op<double,_double> local_531;
  Matrix3xN *local_530;
  Matrix3xN *local_528;
  undefined1 *local_520;
  double local_518;
  double local_510;
  double local_508;
  MatrixNx3c *local_500;
  SrcXprType local_4f8;
  Matrix<double,_3,_3,_1,_3,_3> local_4f0;
  MatrixNx3c *local_4a8;
  Matrix<double,_3,_3,_1,_3,_3> local_4a0;
  MatrixNx3c *local_458;
  Matrix<double,_3,_3,_1,_3,_3> *local_450;
  undefined8 local_448;
  double local_440;
  undefined1 local_438 [64];
  undefined1 local_3f8 [64];
  undefined1 local_3b8 [64];
  undefined8 local_378;
  undefined8 local_370;
  undefined1 local_368 [64];
  undefined1 local_328 [64];
  undefined1 local_2e8 [64];
  undefined8 local_2a0;
  undefined8 local_260 [9];
  undefined8 local_218;
  undefined8 local_1d0;
  undefined1 local_1c8 [64];
  undefined1 local_188 [64];
  undefined1 local_148 [64];
  MatrixNx3c local_108;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->m_SD,0x195,9,0x2d);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_kGQ_D0,0xc,0xc,1);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_kGQ_Dv,3,3,1);
  lVar25 = *(long *)(DAT_00b6ab90 + 0x30);
  lVar16 = *(long *)(DAT_00b6ab90 + 0x38);
  if (lVar16 != lVar25) {
    uVar26 = 0;
    auVar35._56_8_ = 0;
    auVar35._0_56_ = local_368._8_56_;
    local_368 = auVar35 << 0x40;
    auVar35 = vpbroadcastq_avx512f();
    auVar36 = vpaddq_avx512f(auVar35,_DAT_009a7d40);
    auVar37 = vpaddq_avx512f(auVar35,_DAT_009a7d80);
    auVar35 = vpaddq_avx512f(auVar35,_DAT_009a7dc0);
    local_328._0_8_ = &this->m_ebar0;
    local_148 = vmovdqu64_avx512f(auVar36);
    local_188 = vmovdqu64_avx512f(auVar37);
    local_1c8 = vmovdqu64_avx512f(auVar35);
    lVar15 = DAT_00b6ab90;
    do {
      lVar25 = *(long *)(lVar15 + 0x18);
      lVar16 = *(long *)(lVar15 + 0x20);
      if (lVar16 != lVar25) {
        local_530 = (Matrix3xN *)0x0;
        local_2e8._0_8_ = uVar26;
        do {
          if (lVar16 - lVar25 == 0) break;
          puVar20 = (undefined1 *)(lVar16 - lVar25 >> 3);
          puVar22 = (undefined1 *)0x0;
          local_528 = local_530;
          do {
            local_508 = *(double *)(*(long *)(static_tables_3333 + 0x30) + local_368._0_8_ * 8);
            lVar21 = (long)puVar20 * local_368._0_8_;
            pPVar14 = &local_530->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>;
            local_510 = *(double *)(*(long *)(static_tables_3333 + 0x18) + (long)local_530 * 8);
            local_518 = *(double *)(*(long *)(static_tables_3333 + 0x18) + (long)puVar22 * 8);
            local_520 = puVar22;
            Calc_Sxi_D(this,&local_108,*(double *)(*(long *)(lVar15 + 0x30) + local_368._0_8_ * 8),
                       *(double *)(lVar25 + (long)local_530 * 8),
                       *(double *)(lVar25 + (long)puVar22 * 8));
            Eigen::internal::
            generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
            ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>
                      (&local_4f0,(Matrix<double,_3,_9,_1,_3,_9> *)local_328._0_8_,&local_108);
            local_500 = &local_108;
            local_4f8.m_xpr = &local_4f0;
            local_4a8 = &local_108;
            Eigen::internal::
            Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
            ::run(&local_4a0,&local_4f8,&local_531);
            puVar18 = local_260;
            local_458 = local_4a8;
            local_448 = 3;
            auVar31 = *(undefined1 (*) [16])
                       (local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                       m_storage.m_data.array;
            auVar42 = *(undefined1 (*) [16])
                       ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                        m_storage.m_data.array + 2);
            auVar34 = *(undefined1 (*) [16])
                       ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                        m_storage.m_data.array + 4);
            auVar3 = *(undefined1 (*) [16])
                      ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                       m_storage.m_data.array + 6);
            auVar38 = *(undefined1 (*) [16])
                       ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                        m_storage.m_data.array + 9);
            auVar40 = *(undefined1 (*) [16])
                       ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                        m_storage.m_data.array + 0x12);
            auVar44 = *(undefined1 (*) [16])
                       ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                        m_storage.m_data.array + 0xb);
            auVar45 = *(undefined1 (*) [16])
                       ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                        m_storage.m_data.array + 0x14);
            auVar46 = *(undefined1 (*) [16])
                       ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                        m_storage.m_data.array + 0xd);
            auVar4 = *(undefined1 (*) [16])
                      ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                       m_storage.m_data.array + 0x16);
            auVar5 = *(undefined1 (*) [16])
                      ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                       m_storage.m_data.array + 0xf);
            auVar6 = *(undefined1 (*) [16])
                      ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                       m_storage.m_data.array + 0x18);
            dVar1 = (local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                    m_storage.m_data.array[8];
            auVar32._8_8_ = 0;
            auVar32._0_8_ =
                 (local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array[0x11];
            auVar33._8_8_ = 0;
            auVar33._0_8_ =
                 (local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array[0x1a];
            lVar16 = 7;
            do {
              dVar2 = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar16 + 3];
              auVar49._8_8_ = dVar2;
              auVar49._0_8_ = dVar2;
              auVar28._8_8_ = 0;
              auVar28._0_8_ =
                   local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[lVar16 + 6];
              auVar28 = vmovddup_avx512vl(auVar28);
              auVar29._8_8_ = 0;
              auVar29._0_8_ =
                   local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[lVar16 + -1];
              auVar29 = vmovddup_avx512vl(auVar29);
              lVar16 = lVar16 + 1;
              auVar30 = vmulpd_avx512vl(auVar31,auVar49);
              auVar30 = vfmadd231pd_avx512vl(auVar30,auVar38,auVar28);
              auVar30 = vfmadd231pd_avx512vl(auVar30,auVar40,auVar29);
              *(undefined1 (*) [16])(puVar18 + -8) = auVar30;
              auVar30 = vmulpd_avx512vl(auVar42,auVar49);
              auVar30 = vfmadd231pd_avx512vl(auVar30,auVar44,auVar28);
              auVar30 = vfmadd231pd_avx512vl(auVar30,auVar45,auVar29);
              *(undefined1 (*) [16])(puVar18 + -6) = auVar30;
              auVar30 = vmulpd_avx512vl(auVar34,auVar49);
              auVar30 = vfmadd231pd_avx512vl(auVar30,auVar46,auVar28);
              auVar30 = vfmadd231pd_avx512vl(auVar30,auVar4,auVar29);
              *(undefined1 (*) [16])(puVar18 + -4) = auVar30;
              auVar30 = vmulpd_avx512vl(auVar3,auVar49);
              auVar30 = vfmadd231pd_avx512vl(auVar30,auVar5,auVar28);
              auVar30 = vfmadd231pd_avx512vl(auVar30,auVar6,auVar29);
              auVar29 = vmulsd_avx512f(auVar33,auVar29);
              *(undefined1 (*) [16])(puVar18 + -2) = auVar30;
              auVar28 = vmulsd_avx512f(auVar32,auVar28);
              auVar28 = vaddsd_avx512f(auVar28,auVar29);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = dVar1 * dVar2;
              auVar28 = vaddsd_avx512f(auVar30,auVar28);
              *puVar18 = auVar28._0_8_;
              puVar18 = puVar18 + 9;
            } while (lVar16 != 10);
            puVar22 = puVar22 + (long)((long)(pPVar14->m_storage).m_data.array + lVar21) *
                                (long)puVar20;
            local_440 = (double)local_2a0;
            local_438 = vgatherqpd_avx512f(*puVar18);
            local_3f8 = vgatherqpd_avx512f((this->super_ChElementBeam).super_ChElementGeneric.
                                           super_ChElementBase._vptr_ChElementBase);
            local_3b8 = vgatherqpd_avx512f(*puVar18);
            local_378 = local_218;
            local_370 = local_1d0;
            if (((long)puVar22 < 0) ||
               (lVar16 = (this->m_kGQ_D0).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols * (this->m_kGQ_D0).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_rows,
               lVar16 - (long)puVar22 == 0 || lVar16 < (long)puVar22)) goto LAB_007281d7;
            auVar45._8_8_ = 0;
            auVar45._0_8_ =
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[7];
            auVar34._8_8_ = 0;
            auVar34._0_8_ =
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3];
            auVar31._8_8_ = 0;
            auVar31._0_8_ =
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[4];
            auVar42._8_8_ = 0;
            auVar42._0_8_ =
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[8];
            auVar46._8_8_ = 0;
            auVar46._0_8_ =
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[7] *
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[5];
            auVar31 = vfmsub231sd_fma(auVar46,auVar31,auVar42);
            auVar44._8_8_ = 0;
            auVar44._0_8_ =
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[6] *
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[5];
            auVar42 = vfmsub231sd_fma(auVar44,auVar34,auVar42);
            auVar40._8_8_ = 0;
            auVar40._0_8_ =
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[6] *
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[4];
            auVar34 = vfmsub231sd_fma(auVar40,auVar34,auVar45);
            auVar3._8_8_ = 0x8000000000000000;
            auVar3._0_8_ = 0x8000000000000000;
            auVar38._8_8_ = 0;
            auVar38._0_8_ =
                 auVar34._0_8_ *
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[2] +
                 (auVar31._0_8_ *
                  local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[0] -
                 auVar42._0_8_ *
                 local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[1]);
            auVar31 = vxorpd_avx512vl(auVar38,auVar3);
            (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data[(long)puVar22] = local_510 * local_508 * local_518 * auVar31._0_8_;
            pdVar17 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_data;
            lVar16 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
            if (lVar16 < 0 && pdVar17 != (double *)0x0) goto LAB_0072821b;
            lVar25 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols;
            if (lVar25 <= (long)puVar22) goto LAB_007281b5;
            if (lVar16 != 9) goto LAB_007281f9;
            lVar16 = 0;
            puVar20 = local_520 +
                      (long)((long)(local_528->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>).
                                   m_storage.m_data.array + local_2e8._0_8_ * (long)puVar20) *
                      (long)puVar20;
            pdVar24 = pdVar17 + (long)puVar20;
            do {
              lVar15 = lVar16 + -8;
              lVar16 = lVar16 + 0x18;
              *pdVar24 = *(double *)(local_438 + lVar15);
              pdVar24 = pdVar24 + lVar25;
            } while (lVar16 != 0xd8);
            if (((long)(puVar22 + 0xc) < 0) ||
               (lVar16 = (this->m_SD).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_cols, lVar16 <= (long)(puVar22 + 0xc))) goto LAB_007281b5;
            pdVar24 = pdVar17 + (long)(puVar20 + 0xc);
            lVar25 = 8;
            do {
              lVar15 = lVar25 + -8;
              lVar25 = lVar25 + 0x18;
              *pdVar24 = *(double *)(local_438 + lVar15);
              pdVar24 = pdVar24 + lVar16;
            } while (lVar25 != 0xe0);
            if (((long)(puVar22 + 0x18) < 0) ||
               (lVar16 = (this->m_SD).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_cols, lVar16 <= (long)(puVar22 + 0x18))) goto LAB_007281b5;
            pdVar17 = pdVar17 + (long)(puVar20 + 0x18);
            lVar25 = 0x10;
            do {
              lVar15 = lVar25 + -8;
              lVar25 = lVar25 + 0x18;
              *pdVar17 = *(double *)(local_438 + lVar15);
              pdVar17 = pdVar17 + lVar16;
            } while (lVar25 != 0xe8);
            puVar22 = (undefined1 *)(ulong)((int)local_520 + 1);
            lVar16 = *(long *)(DAT_00b6ab90 + 0x20);
            lVar25 = *(long *)(DAT_00b6ab90 + 0x18);
            puVar20 = (undefined1 *)(lVar16 - lVar25 >> 3);
            lVar15 = DAT_00b6ab90;
            local_450 = &local_4a0;
          } while (puVar22 < puVar20);
          local_530 = (Matrix3xN *)(ulong)((int)local_528 + 1);
          uVar26 = local_2e8._0_8_;
        } while (local_530 < puVar20);
      }
      lVar16 = *(long *)(lVar15 + 0x38);
      lVar25 = *(long *)(lVar15 + 0x30);
      uVar26 = CONCAT44(0,(int)uVar26 + 1);
      local_368._0_8_ = uVar26;
    } while (uVar26 < (ulong)(lVar16 - lVar25 >> 3));
  }
  if (lVar16 != lVar25) {
    local_528 = &this->m_ebar0;
    uVar19 = 0x24;
    uVar23 = 0x27;
    uVar26 = 0x2a;
    uVar27 = 0;
    auVar35 = vpbroadcastq_avx512f();
    auVar36 = vpaddq_avx512f(auVar35,_DAT_009a7d40);
    auVar37 = vpaddq_avx512f(auVar35,_DAT_009a7d80);
    auVar35 = vpaddq_avx512f(auVar35,_DAT_009a7dc0);
    local_368 = vmovdqu64_avx512f(auVar36);
    local_2e8 = vmovdqu64_avx512f(auVar37);
    local_328 = vmovdqu64_avx512f(auVar35);
    do {
      local_510 = (double)CONCAT44(local_510._4_4_,uVar19);
      local_530 = (Matrix3xN *)(uVar26 << 3);
      local_518 = (double)CONCAT44(local_518._4_4_,uVar23);
      local_520 = (undefined1 *)CONCAT44(local_520._4_4_,(int)uVar26);
      local_508 = *(double *)(*(long *)(static_tables_3333 + 0x30) + uVar27 * 8);
      local_508 = local_508 + local_508;
      Calc_Sxi_D(this,&local_108,*(double *)(lVar25 + uVar27 * 8),0.0,0.0);
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>(&local_4f0,local_528,&local_108);
      local_500 = &local_108;
      local_4f8.m_xpr = &local_4f0;
      local_4a8 = &local_108;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_4a0,&local_4f8,&local_531);
      puVar18 = local_260;
      local_458 = local_4a8;
      local_448 = 3;
      auVar31 = *(undefined1 (*) [16])
                 (local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array;
      auVar42 = *(undefined1 (*) [16])
                 ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 2);
      auVar34 = *(undefined1 (*) [16])
                 ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 4);
      auVar3 = *(undefined1 (*) [16])
                ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array + 6);
      auVar38 = *(undefined1 (*) [16])
                 ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 9);
      auVar40 = *(undefined1 (*) [16])
                 ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0x12);
      auVar44 = *(undefined1 (*) [16])
                 ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0xb);
      auVar45 = *(undefined1 (*) [16])
                 ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0x14);
      auVar46 = *(undefined1 (*) [16])
                 ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0xd);
      auVar4 = *(undefined1 (*) [16])
                ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array + 0x16);
      auVar5 = *(undefined1 (*) [16])
                ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array + 0xf);
      auVar6 = *(undefined1 (*) [16])
                ((local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array + 0x18);
      dVar1 = (local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage.
              m_data.array[8];
      auVar47._8_8_ = 0;
      auVar47._0_8_ =
           (local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage.
           m_data.array[0x11];
      auVar48._8_8_ = 0;
      auVar48._0_8_ =
           (local_4a8->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage.
           m_data.array[0x1a];
      lVar16 = 7;
      do {
        dVar2 = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[lVar16 + 3];
        auVar50._8_8_ = dVar2;
        auVar50._0_8_ = dVar2;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[lVar16 + 6];
        auVar32 = vmovddup_avx512vl(auVar7);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[lVar16 + -1];
        auVar33 = vmovddup_avx512vl(auVar8);
        lVar16 = lVar16 + 1;
        auVar28 = vmulpd_avx512vl(auVar31,auVar50);
        auVar28 = vfmadd231pd_avx512vl(auVar28,auVar38,auVar32);
        auVar28 = vfmadd231pd_avx512vl(auVar28,auVar40,auVar33);
        *(undefined1 (*) [16])(puVar18 + -8) = auVar28;
        auVar28 = vmulpd_avx512vl(auVar42,auVar50);
        auVar28 = vfmadd231pd_avx512vl(auVar28,auVar44,auVar32);
        auVar28 = vfmadd231pd_avx512vl(auVar28,auVar45,auVar33);
        *(undefined1 (*) [16])(puVar18 + -6) = auVar28;
        auVar28 = vmulpd_avx512vl(auVar34,auVar50);
        auVar28 = vfmadd231pd_avx512vl(auVar28,auVar46,auVar32);
        auVar28 = vfmadd231pd_avx512vl(auVar28,auVar4,auVar33);
        *(undefined1 (*) [16])(puVar18 + -4) = auVar28;
        auVar28 = vmulpd_avx512vl(auVar3,auVar50);
        auVar28 = vfmadd231pd_avx512vl(auVar28,auVar5,auVar32);
        auVar28 = vfmadd231pd_avx512vl(auVar28,auVar6,auVar33);
        auVar33 = vmulsd_avx512f(auVar48,auVar33);
        *(undefined1 (*) [16])(puVar18 + -2) = auVar28;
        auVar32 = vmulsd_avx512f(auVar47,auVar32);
        auVar32 = vaddsd_avx512f(auVar32,auVar33);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = dVar1 * dVar2;
        auVar32 = vaddsd_avx512f(auVar51,auVar32);
        *puVar18 = auVar32._0_8_;
        puVar18 = puVar18 + 9;
      } while (lVar16 != 10);
      local_440 = (double)local_2a0;
      local_438 = vgatherqpd_avx512f(*puVar18);
      local_3f8 = vgatherqpd_avx512f((this->super_ChElementBeam).super_ChElementGeneric.
                                     super_ChElementBase._vptr_ChElementBase);
      local_3b8 = vgatherqpd_avx512f(*puVar18);
      local_378 = local_218;
      local_370 = local_1d0;
      lVar16 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols *
               (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      if (lVar16 - uVar27 == 0 || lVar16 < (long)uVar27) {
LAB_007281d7:
        local_448 = 3;
        local_450 = &local_4a0;
        local_4a8 = local_458;
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      auVar12._8_8_ =
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar12._0_8_ =
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar13._8_8_ =
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[8];
      auVar13._0_8_ =
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar5._8_8_ = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[6];
      auVar5._0_8_ = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[6];
      auVar31 = vmulpd_avx512vl(auVar12,auVar5);
      auVar6._8_8_ = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[3];
      auVar6._0_8_ = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[3];
      auVar34 = vfmsub231pd_avx512vl(auVar31,auVar13,auVar6);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[8];
      auVar43._8_8_ = 0;
      auVar43._0_8_ =
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[7] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar42 = vfmsub132sd_fma(auVar12,auVar43,auVar4);
      auVar11._8_8_ =
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar11._0_8_ =
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar31 = vpermilpd_avx(auVar11,1);
      auVar41._0_8_ = auVar31._0_8_ * auVar34._0_8_;
      auVar41._8_8_ = auVar31._8_8_ * auVar34._8_8_;
      auVar31 = vshufpd_avx(auVar41,auVar41,1);
      auVar9._8_8_ = 0x8000000000000000;
      auVar9._0_8_ = 0x8000000000000000;
      auVar39._8_8_ = 0;
      auVar39._0_8_ =
           auVar41._0_8_ +
           (auVar42._0_8_ *
            local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[0] - auVar31._0_8_);
      auVar31 = vxorpd_avx512vl(auVar39,auVar9);
      (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data[uVar27] = (local_508 + local_508) * auVar31._0_8_;
      pdVar17 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar16 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      if (lVar16 < 0 && pdVar17 != (double *)0x0) {
LAB_0072821b:
        local_448 = 3;
        local_450 = &local_4a0;
        local_458 = local_4a8;
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                     );
      }
      lVar25 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      iVar10 = (int)uVar27;
      if (lVar25 <= (long)(ulong)(iVar10 + 0x24)) {
LAB_007281b5:
        local_448 = 3;
        local_450 = &local_4a0;
        local_4a8 = local_458;
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (lVar16 != 9) {
LAB_007281f9:
        local_448 = 3;
        local_450 = &local_4a0;
        local_458 = local_4a8;
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                     );
      }
      pdVar24 = pdVar17 + uVar19;
      lVar16 = 0;
      do {
        lVar15 = lVar16 + -8;
        lVar16 = lVar16 + 0x18;
        *pdVar24 = *(double *)(local_438 + lVar15);
        pdVar24 = pdVar24 + lVar25;
      } while (lVar16 != 0xd8);
      lVar16 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      if (lVar16 <= (long)(ulong)(iVar10 + 0x27)) goto LAB_007281b5;
      pdVar24 = pdVar17 + uVar23;
      lVar25 = 8;
      do {
        lVar15 = lVar25 + -8;
        lVar25 = lVar25 + 0x18;
        *pdVar24 = *(double *)(local_438 + lVar15);
        pdVar24 = pdVar24 + lVar16;
      } while (lVar25 != 0xe0);
      lVar16 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      if (lVar16 <= (long)(ulong)(iVar10 + 0x2a)) goto LAB_007281b5;
      puVar18 = (undefined8 *)
                ((long)(local_530->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>).
                       m_storage.m_data.array + (long)pdVar17);
      lVar25 = 0x10;
      do {
        lVar15 = lVar25 + -8;
        lVar25 = lVar25 + 0x18;
        *puVar18 = *(undefined8 *)(local_438 + lVar15);
        puVar18 = puVar18 + lVar16;
      } while (lVar25 != 0xe8);
      uVar27 = (ulong)(iVar10 + 1);
      uVar23 = local_518._0_4_ + 1;
      uVar26 = (ulong)((int)local_520 + 1);
      lVar25 = *(long *)(DAT_00b6ab90 + 0x30);
      uVar19 = local_510._0_4_ + 1;
      local_450 = &local_4a0;
    } while (uVar27 < (ulong)(*(long *)(DAT_00b6ab90 + 0x38) - lVar25 >> 3));
  }
  return;
}

Assistant:

void ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsContInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = NP - 1;        // Gauss-Quadrature table index for xi
    unsigned int GQ_idx_eta_zeta = NT - 1;  // Gauss-Quadrature table index for eta and zeta

    m_SD.resize(NSF, 3 * NIP);
    m_kGQ_D0.resize(NIP_D0, 1);
    m_kGQ_Dv.resize(NIP_Dv, 1);

    ChMatrixNM<double, NSF, 3> SD_precompute_D;

    // Precalculate the matrices of normalized shape function derivatives corrected for a potentially non-straight
    // reference configuration & GQ Weights times the determinant of the element Jacobian for later use in the
    // generalized internal force and Jacobian calculations.

    // First calculate the matrices and constants for the portion of the Enhance Continuum Mechanics/Selective Reduced
    // Integration that does not include the Poisson effect.
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];
                auto index = it_zeta + it_eta * GQTable->Lroots[GQ_idx_eta_zeta].size() +
                             it_xi * GQTable->Lroots[GQ_idx_eta_zeta].size() * GQTable->Lroots[GQ_idx_eta_zeta].size();
                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                // Adjust the shape function derivative matrix to account for a potentially deformed reference state
                SD_precompute_D = Sxi_D * J_0xi.inverse();
                m_kGQ_D0(index) = -J_0xi.determinant() * GQ_weight;

                // Group all of the columns together in blocks with the shape function derivatives for the section that
                // does not include the Poisson effect at the beginning of m_SD
                m_SD.col(index) = SD_precompute_D.col(0);
                m_SD.col(index + NIP_D0) = SD_precompute_D.col(1);
                m_SD.col(index + 2 * NIP_D0) = SD_precompute_D.col(2);

                index++;
            }
        }
    }

    // Next calculate the matrices and constants for the portion of the Enhance Continuum Mechanics/Selective Reduced
    // Integration that includes the Poisson effect, but integrating across the volume of the element with one 1 point
    // GQ for the cross section directions.
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * 2 * 2;
        double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
        double eta = 0;
        double zeta = 0;
        ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
        MatrixNx3c Sxi_D;          // Matrix of normalized shape function derivatives

        Calc_Sxi_D(Sxi_D, xi, eta, zeta);
        J_0xi.noalias() = m_ebar0 * Sxi_D;

        // Adjust the shape function derivative matrix to account for a potentially deformed reference state
        SD_precompute_D = Sxi_D * J_0xi.inverse();
        m_kGQ_Dv(it_xi) = -J_0xi.determinant() * GQ_weight;

        // Group all of the columns together in blocks with the shape function derivative for the Poisson effect at the
        // end of m_SD
        m_SD.col(3 * NIP_D0 + it_xi) = SD_precompute_D.col(0);
        m_SD.col(3 * NIP_D0 + NIP_Dv + it_xi) = SD_precompute_D.col(1);
        m_SD.col(3 * NIP_D0 + 2 * NIP_Dv + it_xi) = SD_precompute_D.col(2);
    }
}